

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDIOSimulationDataGenerator.cpp
# Opt level: O2

U32 __thiscall
MDIOSimulationDataGenerator::GenerateSimulationData
          (MDIOSimulationDataGenerator *this,U64 largest_sample_requested,U32 sample_rate,
          SimulationChannelDescriptor **simulation_channels)

{
  MdioOpCode opCode;
  U32 UVar1;
  ulong uVar2;
  ulong uVar3;
  SimulationChannelDescriptor *pSVar4;
  uint uVar5;
  U8 phyAddress;
  U16 regAddress;
  
  uVar2 = AnalyzerHelpers::AdjustSimulationTargetSample
                    (largest_sample_requested,sample_rate,this->mSimulationSampleRateHz);
  uVar5 = (int)this + 0x18;
  phyAddress = '\0';
  regAddress = 0;
  while( true ) {
    uVar3 = SimulationChannelDescriptor::GetCurrentSampleNumber();
    if (uVar2 <= uVar3) break;
    opCode = *(MdioOpCode *)(&DAT_00109420 + (ulong)(byte)((regAddress & 0xff) % 3) * 4);
    CreateMdioC45Transaction
              (this,opCode,phyAddress,
               *(MdioDevType *)(&DAT_00109430 + (ulong)(byte)((regAddress & 0xff) % 7) * 4),
               regAddress,regAddress);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptorGroup::AdvanceAll(uVar5);
    CreateMdioC22Transaction(this,opCode,phyAddress + '\x01',(U8)regAddress,regAddress);
    ClockGenerator::AdvanceByHalfPeriod(20.0);
    SimulationChannelDescriptorGroup::AdvanceAll(uVar5);
    phyAddress = phyAddress + '\x02';
    regAddress = regAddress + 1;
  }
  pSVar4 = (SimulationChannelDescriptor *)SimulationChannelDescriptorGroup::GetArray();
  *simulation_channels = pSVar4;
  UVar1 = SimulationChannelDescriptorGroup::GetCount();
  return UVar1;
}

Assistant:

U32 MDIOSimulationDataGenerator::GenerateSimulationData( U64 largest_sample_requested, U32 sample_rate,
                                                         SimulationChannelDescriptor** simulation_channels )
{
    U64 adjusted_largest_sample_requested =
        AnalyzerHelpers::AdjustSimulationTargetSample( largest_sample_requested, sample_rate, mSimulationSampleRateHz );

    MdioOpCode opcodeValues[ 3 ] = { C45_WRITE, C22_READ, C45_READ }; // address
    U8 opIndex = 0;

    MdioDevType devTypeValues[ 7 ] = { DEV_RESERVED, DEV_PMD_PMA, DEV_WIS, DEV_PCS, DEV_PHY_XS, DEV_DTE_XS, DEV_OTHER };
    U8 devTypeIndex = 0;

    U16 regAddrValue = 0;
    U8 regAddrValue5b = 0;

    U16 dataValueC22 = 0;
    U16 dataValueC45 = 0;
    U8 phyAddressValue = 0;

    while( mMdc->GetCurrentSampleNumber() < adjusted_largest_sample_requested )
    {
        CreateMdioC45Transaction( opcodeValues[ opIndex % 3 ],         // OpCode
                                  phyAddressValue++,                   // PHY Address
                                  devTypeValues[ devTypeIndex++ % 7 ], // DevType
                                  regAddrValue++,                      // Register Address
                                  dataValueC45++                       // Data
        );

        mSimulationChannels.AdvanceAll( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 5 periods of idle

        CreateMdioC22Transaction( opcodeValues[ opIndex++ % 3 ], // OpCode
                                  phyAddressValue++,             // PHY Address
                                  regAddrValue5b++,              // Register Address
                                  dataValueC22++                 // Data
        );

        mSimulationChannels.AdvanceAll( mClockGenerator.AdvanceByHalfPeriod( 20.0 ) ); // insert 10 periods of idle
    }

    *simulation_channels = mSimulationChannels.GetArray();
    return mSimulationChannels.GetCount();
}